

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation.cpp
# Opt level: O0

int main(void)

{
  float *this;
  double dVar1;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  first;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  first_00;
  TerminalInfo term_00;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  last;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  last_00;
  bool bVar2;
  _func_void_int *__handler;
  RealCanvas<plot::BrailleCanvas> *pRVar3;
  ostream *poVar4;
  RealCanvas<plot::BrailleCanvas> **block;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *block_00;
  Rectf RVar5;
  anon_class_16_2_f9f0553c_for_fn_ aVar6;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  aVar7;
  Size SVar8;
  ansi_manip_wrapper<plot::ansi::detail::cursor_move> aVar9;
  uint local_5a0;
  ansi_manip_wrapper<plot::ansi::detail::cursor_move> local_598;
  duration<long,_std::ratio<1L,_1000L>_> local_588;
  ansi_manip_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_&(*)(std::basic_ostream<char,_std::char_traits<char>_>_&)>
  local_580;
  reference local_570;
  value_type *line;
  const_iterator __end2;
  const_iterator __begin2;
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *__range2;
  Pointf local_478;
  Pointf local_470;
  anon_class_8_2_94730b2a *local_468;
  float local_460;
  anon_class_16_2_f9f0553c_for_fn_ local_458;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  local_448;
  anon_class_8_2_94730b2a *local_428;
  float local_420;
  anon_class_16_2_f9f0553c_for_fn_ local_418;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  local_408;
  anon_class_8_2_94730b2a *local_3e8;
  float local_3e0;
  anon_class_16_2_f9f0553c_for_fn_ local_3d8;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  local_3c8;
  anon_class_8_2_94730b2a *local_3a8;
  float local_3a0;
  anon_class_16_2_f9f0553c_for_fn_ local_398;
  map_iterator<range_iterator<float>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fbbdev[P]plot_examples_animation_cpp:67:16)>
  local_388;
  float local_368;
  undefined1 local_364 [4];
  float t;
  range_iterator<float> rng_end;
  range_iterator<float> rng;
  anon_class_1_0_00000001 plot_fn;
  anon_class_8_2_94730b2a cos;
  anon_class_8_2_94730b2a sin;
  float f;
  float A;
  Sizef local_314;
  Sizef pixel;
  Sizef size;
  Rectf bounds;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  RealCanvas<plot::BrailleCanvas> *local_2c0;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> local_2b8;
  undefined1 local_1f0 [8];
  Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> layout;
  GenericPoint<float> local_f8;
  GenericPoint<float> local_f0;
  Rectf local_e8;
  undefined1 local_d8 [8];
  RealCanvas<plot::BrailleCanvas> canvas;
  Color local_48;
  undefined1 auStack_38 [8];
  TerminalInfo term;
  
  term.term_ = 0;
  __handler = main::$_3::operator_cast_to_function_pointer
                        ((__3 *)((long)&term.background_color.a + 3));
  signal(2,(__sighandler_t)__handler);
  plot::Color::Color(&local_48,0.9,0.9,0.9,1.0);
  plot::Color::Color((Color *)&canvas.canvas_.term_.background_color.a,0.0,0.0,0.0,1.0);
  plot::TerminalInfo::TerminalInfo
            ((TerminalInfo *)auStack_38,1,None,local_48,stack0xffffffffffffffa8);
  plot::TerminalInfo::detect<void>((TerminalInfo *)auStack_38);
  plot::GenericPoint<float>::GenericPoint(&local_f0,0.0,1.0);
  plot::GenericPoint<float>::GenericPoint(&local_f8,1.0,-1.0);
  plot::GenericRect<float>::GenericRect(&local_e8,&local_f0,&local_f8);
  this = &layout.block_.term_.background_color.a;
  plot::GenericPoint<long>::GenericPoint((GenericPoint<long> *)this,0x1e,7);
  plot::RealCanvas<plot::BrailleCanvas>::RealCanvas<plot::GenericPoint<long>,plot::TerminalInfo&>
            ((RealCanvas<plot::BrailleCanvas> *)local_d8,local_e8,(GenericPoint<long> *)this,
             (TerminalInfo *)auStack_38);
  local_2d8 = term.foreground_color.g;
  fStack_2d4 = term.foreground_color.b;
  fStack_2d0 = term.foreground_color.a;
  fStack_2cc = term.background_color.r;
  term_00.foreground_color.g = (float)term.mode;
  term_00.foreground_color.b = term.foreground_color.r;
  term_00.mode = auStack_38._0_4_;
  term_00.foreground_color.r = (float)auStack_38._4_4_;
  term_00.foreground_color.a = local_2d8;
  term_00.background_color.r = fStack_2d4;
  term_00.background_color.g = fStack_2d0;
  term_00.background_color.b = fStack_2cc;
  term_00.background_color.a = term.background_color.g;
  term_00.term_ = (Terminal)term.background_color.b;
  local_2c0 = (RealCanvas<plot::BrailleCanvas> *)local_d8;
  plot::frame<plot::RealCanvas<plot::BrailleCanvas>*>(&local_2b8,(plot *)&local_2c0,block,term_00);
  plot::margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
            ((Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)local_1f0,
             (plot *)&local_2b8,block_00);
  RVar5 = plot::RealCanvas<plot::BrailleCanvas>::bounds((RealCanvas<plot::BrailleCanvas> *)local_d8)
  ;
  pixel = plot::RealCanvas<plot::BrailleCanvas>::size((RealCanvas<plot::BrailleCanvas> *)local_d8);
  plot::GenericPoint<long>::GenericPoint((GenericPoint<long> *)&f,1,1);
  local_314 = plot::RealCanvas<plot::BrailleCanvas>::unmap_size
                        ((RealCanvas<plot::BrailleCanvas> *)local_d8,(size_type *)&f);
  rng._12_4_ = pixel.y * 0.5;
  cos.f = 2.0;
  size.x = RVar5.p1.x;
  bounds.p1.x = RVar5.p2.x;
  cos.A = (float)rng._12_4_;
  range_iterator<float>::range_iterator
            ((range_iterator<float> *)&rng_end.step_,size.x,bounds.p1.x + local_314.x,local_314.x);
  range_iterator<float>::range_iterator((range_iterator<float> *)local_364);
  local_368 = 0.0;
  while( true ) {
    pRVar3 = plot::RealCanvas<plot::BrailleCanvas>::clear
                       ((RealCanvas<plot::BrailleCanvas> *)local_d8);
    aVar6 = main::$_0::operator()((void *)((long)&rng.step_ + 3),&cos,local_368);
    local_3a0 = aVar6.t_;
    local_3a8 = aVar6.fn;
    local_398.fn = local_3a8;
    local_398.t_ = local_3a0;
    operator()(&local_388,(range_iterator<float> *)&rng_end.step_,&local_398);
    aVar6 = main::$_0::operator()((void *)((long)&rng.step_ + 3),&cos,local_368);
    local_3e0 = aVar6.t_;
    local_3e8 = aVar6.fn;
    local_3d8.fn = local_3e8;
    local_3d8.t_ = local_3e0;
    operator()(&local_3c8,(range_iterator<float> *)local_364,&local_3d8);
    first.it_.step_ = local_388.it_.step_;
    first.it_.is_end = local_388.it_.is_end;
    first.it_._13_3_ = local_388.it_._13_3_;
    first.it_.start_ = local_388.it_.start_;
    first.it_.end_ = local_388.it_.end_;
    first.fn_.fn._0_4_ = (int)local_388.fn_.fn;
    first.fn_.fn._4_4_ = (int)((ulong)local_388.fn_.fn >> 0x20);
    first.fn_.t_ = local_388.fn_.t_;
    first.fn_._12_4_ = local_388.fn_._12_4_;
    last.it_.step_ = local_3c8.it_.step_;
    last.it_.is_end = local_3c8.it_.is_end;
    last.it_._13_3_ = local_3c8.it_._13_3_;
    last.it_.start_ = local_3c8.it_.start_;
    last.it_.end_ = local_3c8.it_.end_;
    last.fn_.fn = local_3c8.fn_.fn;
    last.fn_.t_ = local_3c8.fn_.t_;
    last.fn_._12_4_ = local_3c8.fn_._12_4_;
    pRVar3 = plot::RealCanvas<plot::BrailleCanvas>::operator()
                       (pRVar3,(Color *)plot::palette::royalblue,first,last);
    aVar6 = main::$_0::operator()
                      ((void *)((long)&rng.step_ + 3),(anon_class_8_2_94730b2a *)&rng.is_end,
                       local_368);
    local_420 = aVar6.t_;
    local_428 = aVar6.fn;
    local_418.fn = local_428;
    local_418.t_ = local_420;
    operator()(&local_408,(range_iterator<float> *)&rng_end.step_,&local_418);
    aVar6 = main::$_0::operator()
                      ((void *)((long)&rng.step_ + 3),(anon_class_8_2_94730b2a *)&rng.is_end,
                       local_368);
    local_460 = aVar6.t_;
    local_468 = aVar6.fn;
    local_458.fn = local_468;
    local_458.t_ = local_460;
    operator()(&local_448,(range_iterator<float> *)local_364,&local_458);
    first_00.it_.step_ = local_408.it_.step_;
    first_00.it_.is_end = local_408.it_.is_end;
    first_00.it_._13_3_ = local_408.it_._13_3_;
    first_00.it_.start_ = local_408.it_.start_;
    first_00.it_.end_ = local_408.it_.end_;
    first_00.fn_.fn._0_4_ = (int)local_408.fn_.fn;
    first_00.fn_.fn._4_4_ = (int)((ulong)local_408.fn_.fn >> 0x20);
    first_00.fn_.t_ = local_408.fn_.t_;
    first_00.fn_._12_4_ = local_408.fn_._12_4_;
    last_00.it_.step_ = local_448.it_.step_;
    last_00.it_.is_end = local_448.it_.is_end;
    last_00.it_._13_3_ = local_448.it_._13_3_;
    last_00.it_.start_ = local_448.it_.start_;
    last_00.it_.end_ = local_448.it_.end_;
    last_00.fn_.fn = local_448.fn_.fn;
    last_00.fn_.t_ = local_448.fn_.t_;
    last_00.fn_._12_4_ = local_448.fn_._12_4_;
    pRVar3 = plot::RealCanvas<plot::BrailleCanvas>::operator()
                       (pRVar3,(Color *)plot::palette::red,first_00,last_00);
    plot::GenericPoint<float>::GenericPoint(&local_470,size.x,0.0);
    plot::GenericPoint<float>::GenericPoint(&local_478,bounds.p1.x,0.0);
    __range2._4_4_ = 2;
    plot::RealCanvas<plot::BrailleCanvas>::line<plot::TerminalOp>
              (pRVar3,(Color *)(auStack_38 + 4),local_470,local_478,
               (TerminalOp *)((long)&__range2 + 4));
    plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::begin
              ((const_iterator *)&__end2.line_.end_.line_.end_.line_.it_,
               (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)local_1f0);
    plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::end
              ((const_iterator *)&line,
               (Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)local_1f0);
    while( true ) {
      bVar2 = plot::detail::
              block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
              ::operator!=((block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                            *)&__end2.line_.end_.line_.end_.line_.it_,
                           (block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                            *)&line);
      if (!bVar2) break;
      local_570 = plot::detail::
                  block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  ::operator*((block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                               *)&__end2.line_.end_.line_.end_.line_.it_);
      aVar7 = plot::TerminalInfo::clear_line((TerminalInfo *)auStack_38);
      local_580.manip = aVar7.manip;
      local_580.mode = aVar7.mode;
      poVar4 = plot::detail::operator<<((ostream *)&std::cout,&local_580);
      poVar4 = plot::detail::operator<<(poVar4,local_570);
      std::operator<<(poVar4,'\n');
      plot::detail::
      block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
      ::operator++((block_iterator<plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::margin_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                    *)&__end2.line_.end_.line_.end_.line_.it_);
    }
    std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
    if (run == 0) break;
    local_588.__r = (rep)ms<(char)52,(char)48>();
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_588);
    if (run == 0) break;
    local_368 = local_368 + 0.01;
    if (1.0 <= local_368) {
      dVar1 = std::trunc((double)(ulong)(uint)local_368);
      local_368 = local_368 - SUB84(dVar1,0);
    }
    SVar8 = plot::Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>::size
                      ((Margin<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_> *)local_1f0);
    local_5a0 = (uint)SVar8.y;
    aVar9 = plot::TerminalInfo::move_up((TerminalInfo *)auStack_38,local_5a0);
    local_598 = aVar9;
    poVar4 = plot::detail::operator<<((ostream *)&std::cout,&local_598);
    std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  }
  term.term_ = 0;
  plot::RealCanvas<plot::BrailleCanvas>::~RealCanvas((RealCanvas<plot::BrailleCanvas> *)local_d8);
  return term.term_;
}

Assistant:

int main() {
    std::signal(SIGINT, [](int) {
        run = false;
    });

    TerminalInfo term;
    term.detect();

    RealCanvas<BrailleCanvas> canvas({ { 0.0f, 1.0f }, { 1.0f, -1.0f } }, Size(30, 7), term);
    auto layout = margin(frame(&canvas, term));

    auto bounds = canvas.bounds();
    auto size = canvas.size();
    auto pixel = canvas.unmap_size({ 1, 1 });

    float A = size.y/2.0f;
    float f = 2.0f;

    auto sin = [A,f](float t) {
        return A*std::sin(2*3.141592f*f*t);
    };

    auto cos = [A,f](float t) {
        return A*std::cos(2*3.141592f*f*t);
    };

    auto plot_fn = [](auto const& fn, float t_) {
        return [&fn, t_](float x) -> Pointf {
            return { x, fn(t_ + x) };
        };
    };

    // Plot function in range [bounds.p1.x, bounds.p2.x] with step of 1px
    // Actually, the range is [bounds.p1.x, bounds.p2.x + 1px)
    range_iterator<float> rng(bounds.p1.x, bounds.p2.x + pixel.x, pixel.x);
    range_iterator<float> rng_end;

    float t = 0.0f;

    while (true) {
        canvas.clear()
              .path(palette::royalblue, map(rng, plot_fn(sin, t)), map(rng_end, plot_fn(sin, t)))
              .path(palette::red, map(rng, plot_fn(cos, t)), map(rng_end, plot_fn(cos, t)))
              .line(term.foreground_color, { bounds.p1.x, 0.0f }, { bounds.p2.x, 0.0f }, TerminalOp::ClipSrc);

        for (auto const& line: layout)
            std::cout << term.clear_line() << line << '\n';

        std::cout << std::flush;

        if (!run)
            break;

        using namespace std::chrono_literals;
        std::this_thread::sleep_for(40ms);

        if (!run)
            break;

        t += 0.01f;
        if (t >= 1.0f)
            t -= std::trunc(t);

        std::cout << term.move_up(layout.size().y) << std::flush;
    }

    return 0;
}